

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O3

void __thiscall xatlas::internal::raster::Triangle::computeUnitInwardNormals(Triangle *this)

{
  float fVar1;
  Vector2 VVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  fVar4 = (this->v1).x;
  fVar1 = (this->v1).y;
  fVar8 = (this->v2).x;
  fVar9 = (this->v2).y;
  fVar3 = fVar4 - fVar8;
  fVar5 = fVar1 - fVar9;
  fVar11 = 1.0 / SQRT(fVar5 * fVar5 + fVar3 * fVar3);
  fVar6 = (this->v3).x;
  fVar7 = (this->v3).y;
  fVar8 = fVar8 - fVar6;
  fVar9 = fVar9 - fVar7;
  fVar10 = 1.0 / SQRT(fVar9 * fVar9 + fVar8 * fVar8);
  (this->n1).x = fVar11 * -fVar5;
  (this->n1).y = fVar11 * fVar3;
  (this->n2).x = fVar10 * -fVar9;
  (this->n2).y = fVar10 * fVar8;
  fVar6 = fVar6 - fVar4;
  fVar7 = fVar7 - fVar1;
  fVar4 = 1.0 / SQRT(fVar7 * fVar7 + fVar6 * fVar6);
  VVar2.y = fVar4 * fVar6;
  VVar2.x = fVar4 * -fVar7;
  this->n3 = VVar2;
  return;
}

Assistant:

void computeUnitInwardNormals()
	{
		n1 = v1 - v2;
		n1 = Vector2(-n1.y, n1.x);
		n1 = n1 * (1.0f / sqrtf(n1.x * n1.x + n1.y * n1.y));
		n2 = v2 - v3;
		n2 = Vector2(-n2.y, n2.x);
		n2 = n2 * (1.0f / sqrtf(n2.x * n2.x + n2.y * n2.y));
		n3 = v3 - v1;
		n3 = Vector2(-n3.y, n3.x);
		n3 = n3 * (1.0f / sqrtf(n3.x * n3.x + n3.y * n3.y));
	}